

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,SequentialStmtBlock *stmt)

{
  bool bVar1;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_00;
  void *key;
  uint64_t uVar2;
  ulong local_108 [2];
  uint64_t seq_signature;
  uint64_t hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  reference local_70;
  EventControl *event_control;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *conditions;
  string cond;
  SequentialStmtBlock *stmt_local;
  HashVisitor *this_local;
  
  cond.field_2._8_8_ = stmt;
  std::__cxx11::string::string((string *)&conditions);
  this_00 = SequentialStmtBlock::get_event_controls((SequentialStmtBlock *)cond.field_2._8_8_);
  __end2 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_00);
  event_control =
       (EventControl *)
       std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                *)&event_control);
    if (!bVar1) break;
    local_70 = __gnu_cxx::
               __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
               ::operator*(&__end2);
    if (local_70->edge == Posedge) {
      (*(local_70->var->super_IRNode)._vptr_IRNode[0x1f])(&local_b0);
      std::operator+(&local_90,"1",&local_b0);
      std::__cxx11::string::append((string *)&conditions);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      (*(local_70->var->super_IRNode)._vptr_IRNode[0x1f])(&hash);
      std::operator+(&local_d0,"0",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hash);
      std::__cxx11::string::append((string *)&conditions);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&hash);
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end2);
  }
  key = (void *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::size();
  uVar2 = hash_64_fnv1a(key,uVar2);
  seq_signature = uVar2 << ((byte)(this->super_IRVisitor).level & 0x3f);
  local_108[1] = 0xf1bbcdcbfa53e0b4;
  local_108[0] = seq_signature ^ 0xf1bbcdcbfa53e0b4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,local_108);
  std::__cxx11::string::~string((string *)&conditions);
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        std::string cond;
        auto const& conditions = stmt->get_event_controls();
        for (auto const& event_control : conditions) {
            if (event_control.edge == EventEdgeType::Posedge)
                cond.append("1" + event_control.var->to_string());
            else
                cond.append("0" + event_control.var->to_string());
        }
        uint64_t hash = hash_64_fnv1a(cond.c_str(), cond.size()) << level;
        constexpr uint64_t seq_signature = shift_const(0x9e3779b97f4a7c16, 3);
        stmt_hashes_.emplace_back(hash ^ seq_signature);
    }